

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallGenerator::CreateComponentTest
          (string *__return_storage_ptr__,cmInstallGenerator *this,string *component,
          bool exclude_from_all,bool all_components)

{
  allocator<char> local_36;
  undefined1 local_35;
  allocator<char> local_23;
  undefined1 local_22;
  byte local_21;
  bool all_components_local;
  string *psStack_20;
  bool exclude_from_all_local;
  string *component_local;
  cmInstallGenerator *this_local;
  string *result;
  
  local_22 = all_components;
  local_21 = exclude_from_all;
  psStack_20 = component;
  component_local = (string *)this;
  this_local = (cmInstallGenerator *)__return_storage_ptr__;
  if (all_components) {
    if (exclude_from_all) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"CMAKE_INSTALL_COMPONENT",&local_23);
      std::allocator<char>::~allocator(&local_23);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
  }
  else {
    local_35 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"CMAKE_INSTALL_COMPONENT STREQUAL \"",&local_36);
    std::allocator<char>::~allocator(&local_36);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psStack_20);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
    if ((local_21 & 1) == 0) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__," OR NOT CMAKE_INSTALL_COMPONENT");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallGenerator::CreateComponentTest(
  const std::string& component, bool exclude_from_all, bool all_components)
{
  if (all_components) {
    if (exclude_from_all) {
      return "CMAKE_INSTALL_COMPONENT";
    }
    return {};
  }

  std::string result = "CMAKE_INSTALL_COMPONENT STREQUAL \"";
  result += component;
  result += "\"";
  if (!exclude_from_all) {
    result += " OR NOT CMAKE_INSTALL_COMPONENT";
  }

  return result;
}